

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O2

void predict_or_learn<true>(LRQstate *lrq,single_learner *base,example *ec)

{
  _Rb_tree_header *p_Var1;
  features *this;
  size_t i;
  float fVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint32_t uVar6;
  vw *pvVar7;
  byte *pbVar8;
  uint64_t uVar9;
  unsigned_long uVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong uVar19;
  features *pfVar20;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ulong uVar21;
  weight *pwVar22;
  ostream *poVar23;
  char *pcVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  _Rb_tree_node_base *p_Var25;
  uint32_t *puVar26;
  long lVar27;
  size_t *__s;
  uint uVar28;
  v_array<unsigned_char> *__range1;
  float fVar29;
  float fVar30;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  size_t local_270;
  char *new_feature;
  char *new_space;
  char *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  stringstream new_feature_buffer;
  ostream local_1a8;
  
  pvVar7 = lrq->all;
  __s = lrq->orig_size;
  memset(__s,0,0x800);
  pbVar8 = (ec->super_example_predict).indices._end;
  for (pbVar17 = (ec->super_example_predict).indices._begin; pbVar17 != pbVar8;
      pbVar17 = pbVar17 + 1) {
    bVar3 = *pbVar17;
    if (lrq->lrindices[bVar3] == true) {
      __s[bVar3] = (long)(ec->super_example_predict).feature_space[bVar3].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar3].values._begin >> 2;
    }
  }
  fVar2 = (ec->l).simple.label;
  bVar4 = lrq->dropout;
  fVar30 = 1.0;
  if (bVar4 != false) {
    fVar30 = 0.5;
  }
  bVar11 = fVar2 == 3.4028235e+38;
  fVar29 = 1.0;
  if ((bVar11) && (!NAN(fVar2))) {
    fVar29 = fVar30;
  }
  local_270 = ec->example_counter;
  p_Var1 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  puVar26 = &(pvVar7->weights).dense_weights._stride_shift;
  if ((pvVar7->weights).sparse != false) {
    puVar26 = &(pvVar7->weights).sparse_weights._stride_shift;
  }
  uVar6 = *puVar26;
  local_2b8 = 0.0;
  local_2bc = 0.0;
  local_2c0 = 0.0;
  for (iVar16 = 0; iVar16 != 2 - (uint)bVar11; iVar16 = iVar16 + 1) {
    uVar18 = (ulong)((uint)local_270 & 1);
    uVar19 = uVar18 ^ 1;
    for (p_Var25 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var25 != p_Var1;
        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25)) {
      lVar27 = *(long *)(p_Var25 + 1);
      bVar3 = *(byte *)(lVar27 + uVar18);
      bVar5 = *(byte *)(lVar27 + uVar19);
      uVar13 = atoi((char *)(lVar27 + 2));
      pfVar20 = (ec->super_example_predict).feature_space + bVar3;
      this = (ec->super_example_predict).feature_space + bVar5;
      this_00 = &(ec->super_example_predict).feature_space[bVar5].space_names;
      for (uVar15 = 0; uVar21 = (ulong)uVar15, uVar21 < __s[bVar3]; uVar15 = uVar15 + 1) {
        fVar2 = (pfVar20->values)._begin[uVar21];
        uVar9 = (ec->super_example_predict).ft_offset;
        uVar10 = (pfVar20->indicies)._begin[uVar21];
        for (uVar14 = 1; uVar14 <= uVar13; uVar14 = uVar14 + 1) {
          if ((bVar11 || bVar4 != true) || (bVar12 = cheesyrbit(&lrq->seed), bVar12)) {
            lVar27 = (ulong)uVar14 << ((byte)uVar6 & 0x3f);
            i = uVar9 + uVar10 + lVar27;
            pwVar22 = parameters::operator[](&lrq->all->weights,i);
            fVar30 = (ec->l).simple.label;
            if (((fVar30 != 3.4028235e+38) || (NAN(fVar30))) &&
               ((*pwVar22 == 0.0 && (!NAN(*pwVar22))))) {
              fVar30 = cheesyrand(i);
              *pwVar22 = fVar30;
            }
            for (uVar28 = 0; uVar21 = (ulong)uVar28, uVar21 < __s[bVar5]; uVar28 = uVar28 + 1) {
              features::push_back(this,*pwVar22 * fVar29 * fVar2 * (this->values)._begin[uVar21],
                                  (this->indicies)._begin[uVar21] + lVar27);
              if ((pvVar7->audit != false) || (pvVar7->hash_inv == true)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&new_feature_buffer);
                poVar23 = std::operator<<(&local_1a8,bVar5);
                poVar23 = std::operator<<(poVar23,'^');
                poVar23 = std::operator<<(poVar23,(string *)
                                                  &(this_00->_begin[uVar21].
                                                                                                        
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->second);
                poVar23 = std::operator<<(poVar23,'^');
                std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
                new_space = strdup("lrq");
                std::__cxx11::stringbuf::str();
                pcVar24 = strdup(local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                new_feature = pcVar24;
                this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)operator_new(0x40);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<char_*&,_char_*&,_true>(this_01,&new_space,&new_feature);
                std::
                __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                            *)&local_1d8,this_01);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_1d8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1d0);
                std::__cxx11::stringstream::~stringstream((stringstream *)&new_feature_buffer);
              }
            }
          }
        }
      }
    }
    LEARNER::learner<char,_example>::learn(base,ec,0);
    if (iVar16 == 0) {
      local_2c0 = (ec->pred).scalar;
      local_2bc = ec->loss;
      local_2b8 = ec->confidence;
    }
    else {
      (ec->pred).scalar = local_2c0;
      ec->loss = local_2bc;
      ec->confidence = local_2b8;
    }
    for (p_Var25 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var25 != p_Var1;
        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25)) {
      bVar3 = *(byte *)(*(long *)(p_Var25 + 1) + uVar19);
      features::truncate_to((ec->super_example_predict).feature_space + bVar3,__s[bVar3]);
    }
    local_270 = local_270 + 1;
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}